

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_ns_local_search.h
# Opt level: O2

void __thiscall
fm_ns_local_search::move_node
          (fm_ns_local_search *this,AdjList *G,NodeID *node,PartitionID *to_block,
          PartitionID *other_block,vector<int,_std::allocator<int>_> *block_weights,
          vector<bool,_std::allocator<bool>_> *moved_out_of_S,
          vector<maxNodeHeap,_std::allocator<maxNodeHeap>_> *queues,
          vector<change_set,_std::allocator<change_set>_> *rollback_info,PartialBoundary *separator)

{
  uint uVar1;
  pointer piVar2;
  pointer pvVar3;
  uint *puVar4;
  int *piVar5;
  pointer pmVar6;
  pointer piVar7;
  int iVar8;
  int *piVar9;
  uint *puVar10;
  reference rVar11;
  Gain toRHS;
  vector<int,_std::allocator<int>_> to_be_added;
  change_set cur_move;
  uint local_a4;
  value_type local_a0;
  AdjList *local_98;
  int local_8c;
  _Vector_base<int,_std::allocator<int>_> local_88;
  _Vector_base<int,_std::allocator<int>_> local_68;
  int *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  int *local_40;
  value_type local_38;
  
  local_38.node = *node;
  local_38.block =
       (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start[local_38.node];
  local_98 = G;
  std::vector<change_set,_std::allocator<change_set>_>::push_back(rollback_info,&local_38);
  PartialBoundary::deleteNode(separator,*node);
  iVar8 = *to_block;
  (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start[*node] = iVar8;
  piVar2 = (block_weights->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar9 = piVar2 + iVar8;
  *piVar9 = *piVar9 + 1;
  piVar9 = piVar2 + 2;
  *piVar9 = *piVar9 + -1;
  local_48 = block_weights;
  rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](moved_out_of_S,(long)*node);
  *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
  std::vector<int,_std::allocator<int>_>::push_back(&this->moved_nodes,node);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = (local_98->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (uint *)pvVar3[*node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  local_50 = other_block;
  local_40 = node;
  for (puVar10 = *(uint **)&pvVar3[*node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data;
      piVar2 = local_68._M_impl.super__Vector_impl_data._M_finish, puVar10 != puVar4;
      puVar10 = puVar10 + 1) {
    local_a4 = *puVar10;
    if ((this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[(int)local_a4] < 0) {
      piVar2 = (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar2[*local_40] == *other_block) {
        local_a0.block = piVar2[(int)local_a4];
        local_a0.node = local_a4;
        std::vector<change_set,_std::allocator<change_set>_>::push_back(rollback_info,&local_a0);
        (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[(int)local_a4] = 2;
        PartialBoundary::insert(separator,local_a4);
        piVar2 = (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar9 = piVar2 + *other_block;
        *piVar9 = *piVar9 + -1;
        piVar9 = piVar2 + 2;
        *piVar9 = *piVar9 + 1;
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (moved_out_of_S,(long)(int)local_a4);
        if ((*rVar11._M_p & rVar11._M_mask) == 0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&local_68,
                     (value_type_conflict1 *)&local_a4);
        }
        pvVar3 = (local_98->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        piVar5 = pvVar3[(int)local_a4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar9 = pvVar3[(int)local_a4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start; other_block = local_50, piVar9 != piVar5;
            piVar9 = piVar9 + 1) {
          local_8c = *piVar9;
          if (((this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[local_8c] < 0) &&
             (iVar8 = (*(((queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>).
                          _M_impl.super__Vector_impl_data._M_start)->super_priority_queue_interface)
                        ._vptr_priority_queue_interface[0xd])(), (char)iVar8 != '\0')) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&local_88,&local_8c);
          }
        }
      }
      else if (piVar2[(int)local_a4] == 2) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&local_88,(value_type_conflict1 *)&local_a4)
        ;
      }
    }
  }
  local_a0.node = 0;
  local_a4 = 0;
  for (puVar10 = (uint *)local_68._M_impl.super__Vector_impl_data._M_start;
      piVar7 = local_88._M_impl.super__Vector_impl_data._M_finish, puVar10 != (uint *)piVar2;
      puVar10 = puVar10 + 1) {
    uVar1 = *puVar10;
    compute_gain(this,local_98,uVar1,&local_a0.node,(Gain *)&local_a4);
    pmVar6 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (*(pmVar6->super_priority_queue_interface)._vptr_priority_queue_interface[4])
              (pmVar6,(ulong)uVar1,(ulong)(uint)local_a0.node);
    pmVar6 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (*pmVar6[1].super_priority_queue_interface._vptr_priority_queue_interface[4])
              (pmVar6 + 1,(ulong)uVar1,(ulong)local_a4);
  }
  for (puVar10 = (uint *)local_88._M_impl.super__Vector_impl_data._M_start;
      puVar10 != (uint *)piVar7; puVar10 = puVar10 + 1) {
    uVar1 = *puVar10;
    compute_gain(this,local_98,uVar1,&local_a0.node,(Gain *)&local_a4);
    pmVar6 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (*(pmVar6->super_priority_queue_interface)._vptr_priority_queue_interface[10])
              (pmVar6,(ulong)uVar1,(ulong)(uint)local_a0.node);
    pmVar6 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (*pmVar6[1].super_priority_queue_interface._vptr_priority_queue_interface[10])
              (pmVar6 + 1,(ulong)uVar1,(ulong)local_a4);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

inline
void fm_ns_local_search::move_node( AdjList & G, NodeID & node, PartitionID & to_block, PartitionID & other_block, 
                                    std::vector< NodeWeight > & block_weights,
                                    std::vector< bool > & moved_out_of_S, 
                                    std::vector< maxNodeHeap > & queues,
                                    std::vector< change_set > & rollback_info,
                                    PartialBoundary & separator) {

        change_set cur_move;
        cur_move.node = node;
        cur_move.block = partition_index[node];
        rollback_info.push_back(cur_move);
        separator.deleteNode(node);

        partition_index[node] = to_block;
        block_weights[to_block] += 1;
        block_weights[2] -= 1;
        moved_out_of_S[node] = true;
        moved_nodes.push_back(node);

        std::vector<NodeID> to_be_added;
        std::vector<NodeID> to_be_updated; // replace by hashmap?
        Gain gain_achieved = 1;

        for (int neighbor : G[node]) 
        {
                if (x[neighbor] < 0) {
                        if(partition_index[node] == other_block) {
                                change_set cur_move;
                                cur_move.node = neighbor;
                                cur_move.block = partition_index[neighbor];
                                rollback_info.push_back(cur_move);

                                partition_index[neighbor] = 2;
                                separator.insert(neighbor);

                                block_weights[other_block] -= 1;
                                block_weights[2]           += 1;
                                gain_achieved              -= 1;

                                if(!moved_out_of_S[neighbor]) {
                                        to_be_added.push_back(neighbor);
                                }

                                for (int v : G[neighbor]) {
                                        if(x[v] < 0) {
                                                if(queues[0].contains(v)) {
                                                        to_be_updated.push_back(v);
                                                }   
                                        }
                                }

                        } else if(partition_index[neighbor] == 2) {
                                to_be_updated.push_back(neighbor);
                        }
                }
        }        

        Gain toLHS = 0;
        Gain toRHS = 0;

        for(NodeID node : to_be_added) {
                compute_gain( G, node, toLHS, toRHS);
                queues[0].insert(node, toLHS);
                queues[1].insert(node, toRHS);
        }

        for(NodeID node : to_be_updated) {
                compute_gain( G, node, toLHS, toRHS);
                queues[0].changeKey(node, toLHS);
                queues[1].changeKey(node, toRHS);
        }
}